

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.h
# Opt level: O1

void __thiscall TPZStream::Write<double>(TPZStream *this,TPZVec<double> *vec)

{
  int64_t nel;
  long local_20;
  
  local_20 = vec->fNElements;
  (*this->_vptr_TPZStream[5])(this,&local_20,1);
  if (local_20 != 0) {
    (*this->_vptr_TPZStream[8])(this,vec->fStore,(ulong)(uint)vec->fNElements);
  }
  return;
}

Assistant:

void Write(const TPZVec<T> &vec) {
      int64_t nel = vec.NElements();
      this->Write(&nel);
      if constexpr(
            std::is_same<std::string, T>::value ||
            is_arithmetic_pz<T>::value){
        if (nel)
          this->Write(&vec[0], vec.NElements());
      }
      else{
          for (auto c = 0; c < nel; c++) {
            vec[c].Write(*this, 0);
        }
      }
    }